

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterSparseCoDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  int iVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  pointer pnVar4;
  int *piVar5;
  int32_t iVar6;
  undefined8 uVar7;
  int iVar8;
  DataKey DVar9;
  long lVar10;
  long lVar11;
  pointer pnVar12;
  undefined4 *puVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  uint *puVar16;
  pointer pnVar17;
  devexpr *pdVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar19;
  cpp_dec_float<200U,_int,_void> *pcVar20;
  byte bVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_2e4;
  undefined1 local_2b8 [32];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [13];
  undefined3 uStack_24b;
  int iStack_248;
  bool bStack_244;
  undefined8 local_240;
  cpp_dec_float<200U,_int,_void> local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  devexpr local_b0 [112];
  int local_40;
  byte local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  bVar21 = 0;
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar3 = (pSVar2->theTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar4 = (pSVar2->weights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_240._0_4_ = cpp_dec_float_finite;
  local_240._4_4_ = 0x1c;
  local_2b8._0_16_ = (undefined1  [16])0x0;
  local_2b8._16_16_ = (undefined1  [16])0x0;
  local_298 = (undefined1  [16])0x0;
  local_288 = (undefined1  [16])0x0;
  local_278 = (undefined1  [16])0x0;
  local_268 = (undefined1  [16])0x0;
  local_258 = SUB1613((undefined1  [16])0x0,0);
  uStack_24b = 0;
  iStack_248 = 0;
  bStack_244 = false;
  lVar11 = (long)(pSVar2->infeasibilitiesCo).super_IdxSet.num;
  if (lVar11 < 1) {
    local_2e4 = -1;
  }
  else {
    lVar11 = lVar11 + 1;
    local_2e4 = -1;
    do {
      iVar1 = (((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->infeasibilitiesCo).super_IdxSet.idx[lVar11 + -2];
      pnVar12 = pnVar3 + iVar1;
      pcVar15 = (cpp_dec_float<200U,_int,_void> *)local_2b8;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pcVar15->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar21 * -2 + 1) * 4);
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar21 * -8 + 4);
      }
      iStack_248 = pnVar3[iVar1].m_backend.exp;
      bStack_244 = pnVar3[iVar1].m_backend.neg;
      local_240._0_4_ = pnVar3[iVar1].m_backend.fpclass;
      local_240._4_4_ = pnVar3[iVar1].m_backend.prec_elem;
      pnVar14 = feastol;
      pcVar15 = &local_230;
      for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pcVar15->data)._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar21 * -2 + 1) * 4);
        pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar21 * -8 + 4);
      }
      local_230.exp = (feastol->m_backend).exp;
      local_230.neg = (feastol->m_backend).neg;
      local_230.fpclass = (feastol->m_backend).fpclass;
      local_230.prec_elem = (feastol->m_backend).prec_elem;
      if (local_230.data._M_elems[0] != 0 || local_230.fpclass != cpp_dec_float_finite) {
        local_230.neg = (bool)(local_230.neg ^ 1);
      }
      if (local_230.fpclass == cpp_dec_float_NaN || (fpclass_type)local_240 == cpp_dec_float_NaN) {
LAB_005af784:
        pSVar2 = (this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
        piVar5 = (pSVar2->infeasibilitiesCo).super_IdxSet.idx;
        iVar8 = (pSVar2->infeasibilitiesCo).super_IdxSet.num;
        (pSVar2->infeasibilitiesCo).super_IdxSet.num = iVar8 + -1;
        piVar5[lVar11 + -2] = piVar5[(long)iVar8 + -1];
        (pSVar2->isInfeasibleCo).data[iVar1] = 0;
        uVar7 = local_240;
      }
      else {
        iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)local_2b8,&local_230);
        if (-1 < iVar8) goto LAB_005af784;
        puVar13 = (undefined4 *)local_2b8;
        pdVar18 = local_b0;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          *(undefined4 *)pdVar18 = *puVar13;
          puVar13 = puVar13 + (ulong)bVar21 * -2 + 1;
          pdVar18 = pdVar18 + (ulong)bVar21 * -8 + 4;
        }
        local_40 = iStack_248;
        local_3c = bStack_244;
        local_38 = (fpclass_type)local_240;
        iStack_34 = local_240._4_4_;
        pnVar12 = pnVar4 + iVar1;
        pnVar17 = pnVar12;
        pnVar14 = &local_130;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar14->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
          pnVar17 = (pointer)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        local_130.m_backend.exp = pnVar4[iVar1].m_backend.exp;
        local_130.m_backend.neg = pnVar4[iVar1].m_backend.neg;
        local_130.m_backend.fpclass = pnVar4[iVar1].m_backend.fpclass;
        local_130.m_backend.prec_elem = pnVar4[iVar1].m_backend.prec_elem;
        pnVar14 = feastol;
        pnVar19 = &local_1b0;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar19->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar21 * -2 + 1) * 4);
          pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar19 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        local_1b0.m_backend.exp = (feastol->m_backend).exp;
        local_1b0.m_backend.neg = (feastol->m_backend).neg;
        local_1b0.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_1b0.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_230,local_b0,&local_130,&local_1b0,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_b0);
        pcVar15 = &local_230;
        pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_2b8;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pcVar20->data)._M_elems[0] = (pcVar15->data)._M_elems[0];
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar21 * -8 + 4);
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar21 * -8 + 4);
        }
        iStack_248 = local_230.exp;
        bStack_244 = local_230.neg;
        uVar7._0_4_ = local_230.fpclass;
        uVar7._4_4_ = local_230.prec_elem;
        local_240._0_4_ = local_230.fpclass;
        local_240._4_4_ = local_230.prec_elem;
        if ((local_230.fpclass != cpp_dec_float_NaN) &&
           ((best->m_backend).fpclass != cpp_dec_float_NaN)) {
          iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_2b8,&best->m_backend);
          uVar7 = local_240;
          if (0 < iVar8) {
            puVar16 = (uint *)local_2b8;
            pnVar14 = best;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pnVar14->m_backend).data._M_elems[0] = *puVar16;
              puVar16 = puVar16 + (ulong)bVar21 * -2 + 1;
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar14 + ((ulong)bVar21 * -2 + 1) * 4);
            }
            (best->m_backend).exp = iStack_248;
            (best->m_backend).neg = bStack_244;
            (best->m_backend).fpclass = (fpclass_type)local_240;
            (best->m_backend).prec_elem = local_240._4_4_;
            pnVar17 = pnVar12;
            pnVar14 = &this->last;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pnVar14->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
              pnVar17 = (pointer)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar14 + (ulong)bVar21 * -8 + 4);
            }
            (this->last).m_backend.exp = (pnVar12->m_backend).exp;
            (this->last).m_backend.neg = (pnVar12->m_backend).neg;
            iVar6 = (pnVar12->m_backend).prec_elem;
            (this->last).m_backend.fpclass = (pnVar12->m_backend).fpclass;
            (this->last).m_backend.prec_elem = iVar6;
            local_2e4 = iVar1;
          }
        }
      }
      local_240 = uVar7;
      lVar11 = lVar11 + -1;
    } while (1 < lVar11);
  }
  if (local_2e4 < 0) {
    DVar9.info = 0;
    DVar9.idx = -1;
  }
  else {
    DVar9 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::id((this->
                          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).thesolver,local_2e4);
  }
  return (SPxId)DVar9;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterSparseCoDim(R& best, R feastol)
{
   const R* test = this->thesolver->test().get_const_ptr();
   const R* pen = this->thesolver->weights.get_const_ptr();
   int enterIdx = -1;
   int idx;
   R x;

   assert(this->thesolver->weights.dim() == this->thesolver->test().dim());

   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = test[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, pen[idx], feastol);

         if(x > best)
         {
            best = x;
            enterIdx = idx;
            last = pen[idx];
         }
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);

   return SPxId();
}